

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sTessellationGeometryInteractionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Stress::anon_unknown_1::GridRenderCase::iterate(GridRenderCase *this)

{
  pointer pSVar1;
  ostringstream *this_00;
  uint uVar2;
  RenderContext *context;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  TestLog *pTVar6;
  TestError *this_01;
  runtime_error *this_02;
  ConstPixelBufferAccess *pCVar7;
  LogImageSet *this_03;
  int iVar8;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  long lVar9;
  qpTestResult testResult;
  undefined8 uVar10;
  int iVar11;
  TextureFormat TVar12;
  void *pvVar13;
  byte bVar14;
  long lVar15;
  Surface errorMask;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> renderedLayers;
  VertexArray vao;
  string local_460;
  string local_440;
  Surface local_420;
  string local_408;
  long local_3e8;
  undefined1 local_3e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  string local_390;
  string local_370;
  string local_350;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> local_330;
  TextureFormat local_318;
  undefined1 local_310 [32];
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [6];
  LogImageSet local_280;
  LogImage local_240;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [104];
  ios_base local_138 [264];
  
  std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::vector
            (&local_330,(long)this->m_numLayers,(allocator_type *)local_1b0);
  if (0 < this->m_numLayers) {
    lVar9 = 0;
    lVar15 = 0;
    do {
      tcu::Surface::setSize
                ((Surface *)
                 ((long)&(local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_width + lVar9),0x100,0x100);
      lVar15 = lVar15 + 1;
      lVar9 = lVar9 + 0x18;
    } while (lVar15 < this->m_numLayers);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
             ,0x86);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  iVar3 = (**(code **)(lVar9 + 0x780))((this->m_program->m_program).m_program,"a_position");
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_310,(Functions *)CONCAT44(extraout_var_00,iVar4),traits);
  if (iVar3 == -1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Attribute a_position location was -1","");
    tcu::TestError::TestError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar9 + 0x1a00))
            (0,0,(local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_width,
             (local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
              super__Vector_impl_data._M_start)->m_height);
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                  ,0x157);
  (**(code **)(lVar9 + 0xd8))(local_310._16_4_);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"bind vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                  ,0x15a);
  (**(code **)(lVar9 + 0x1680))((this->m_program->m_program).m_program);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                  ,0x15d);
  (**(code **)(lVar9 + 0xfd8))(0x8e72,1);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                  ,0x160);
  (**(code **)(lVar9 + 0x1858))(0,0,0,0x3f800000,iVar3);
  (**(code **)(lVar9 + 0x188))(0x4000);
  (**(code **)(lVar9 + 0x538))(0xe,0,1);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  if (dVar5 == 0x505) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"got GL_OUT_OF_MEMORY while drawing");
    *(undefined ***)this_02 = &PTR__runtime_error_021ae620;
    __cxa_throw(this_02,&Stress::(anonymous_namespace)::AllowedRenderFailureException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  glu::checkError(dVar5,"draw patches",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                  ,0x172);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
  pvVar13 = (void *)((local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                      _M_impl.super__Vector_impl_data._M_start)->m_pixels).m_cap;
  if (pvVar13 != (void *)0x0) {
    pvVar13 = ((local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                super__Vector_impl_data._M_start)->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_240,
             (local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
              super__Vector_impl_data._M_start)->m_width,
             (local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
              super__Vector_impl_data._M_start)->m_height,1,pvVar13);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"read pixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                  ,0x178);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_310);
  if (this->m_numLayers < 1) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    bVar14 = 1;
    lVar9 = 0;
    do {
      pSVar1 = local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_3e8 = lVar9;
      tcu::Surface::Surface
                (&local_420,
                 local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9].m_width,
                 local_330.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9].m_height);
      local_310._0_8_ = (Functions *)0x300000008;
      pvVar13 = (void *)local_420.m_pixels.m_cap;
      if ((void *)local_420.m_pixels.m_cap != (void *)0x0) {
        pvVar13 = local_420.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,(TextureFormat *)local_310,local_420.m_width,
                 local_420.m_height,1,pvVar13);
      local_310._0_8_ = (Functions *)0x3f80000000000000;
      local_310._8_8_ = (ObjectTraits *)0x3f80000000000000;
      tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)local_310);
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Verifying output layer ",0x17);
      std::ostream::operator<<(local_1b0 + 8,(int)local_3e8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      pSVar1 = pSVar1 + lVar9;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      iVar4 = 0;
      iVar3 = iVar4;
      if (0 < pSVar1->m_height) {
        pvVar13 = (pSVar1->m_pixels).m_ptr;
        iVar3 = 0;
        do {
          iVar11 = pSVar1->m_width;
          if (0 < iVar11) {
            iVar8 = 0;
            do {
              uVar2 = *(uint *)((long)pvVar13 + (long)(iVar11 * iVar4 + iVar8) * 4);
              if ((uVar2 & 0xff00) < 0xf700 || 0x80000 < (uVar2 & 0xff0000)) {
                *(undefined4 *)
                 ((long)local_420.m_pixels.m_ptr + (long)(local_420.m_width * iVar4 + iVar8) * 4) =
                     0xff0000ff;
                iVar3 = 1;
              }
              iVar8 = iVar8 + 1;
              iVar11 = pSVar1->m_width;
            } while (iVar8 < iVar11);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < pSVar1->m_height);
      }
      if (iVar3 == 0) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"Image valid.",0xc);
        pTVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_3e0._0_8_ = &local_3d0;
        local_310._0_8_ = (Functions *)0x11;
        local_3e0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_3e0,(ulong)local_310);
        local_3d0._M_allocated_capacity = local_310._0_8_;
        *(undefined8 *)local_3e0._0_8_ = 0x7265566567616d49;
        builtin_strncpy((char *)(local_3e0._0_8_ + 8),"ificatio",8);
        *(char *)(local_3e0._0_8_ + 0x10) = 'n';
        local_3e0._8_8_ = local_310._0_8_;
        *(char *)(local_310._0_8_ + local_3e0._0_8_) = '\0';
        local_3b8._0_8_ = &local_3a8;
        local_310._0_8_ = (Functions *)0x12;
        local_3b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)local_310);
        local_3a8._M_allocated_capacity = local_310._0_8_;
        *(undefined8 *)local_3b8._0_8_ = 0x6576206567616d49;
        builtin_strncpy((char *)(local_3b8._0_8_ + 8),"rificati",8);
        *(undefined2 *)(local_3b8._0_8_ + 0x10) = 0x6e6f;
        local_3b8._8_8_ = local_310._0_8_;
        *(char *)(local_310._0_8_ + local_3b8._0_8_) = '\0';
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&local_240,(string *)local_3e0,(string *)local_3b8);
        tcu::TestLog::startImageSet
                  (pTVar6,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p
                  );
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        local_460._M_string_length = 6;
        local_460.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        local_440.field_2._8_7_ = 0x746c7573657220;
        local_440.field_2._M_allocated_capacity._0_7_ = 0x657265646e6552;
        local_440.field_2._M_local_buf[7] = 'd';
        local_440._M_string_length = 0xf;
        local_440.field_2._M_local_buf[0xf] = '\0';
        local_408._M_dataplus._M_p = (pointer)0x300000008;
        pvVar13 = (void *)(pSVar1->m_pixels).m_cap;
        if (pvVar13 != (void *)0x0) {
          pvVar13 = (pSVar1->m_pixels).m_ptr;
        }
        this_03 = &local_280;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)this_03,(TextureFormat *)&local_408,pSVar1->m_width,
                   pSVar1->m_height,1,pvVar13);
        tcu::LogImage::LogImage
                  ((LogImage *)local_310,&local_460,&local_440,(ConstPixelBufferAccess *)this_03,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_310,(int)pTVar6,__buf_01,(size_t)this_03);
        tcu::TestLog::endImageSet(pTVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_p != local_2e0) {
          operator_delete(local_2f0._M_p,local_2e0[0]._M_allocated_capacity + 1);
        }
        if ((Functions *)local_310._0_8_ != (Functions *)(local_310 + 0x10)) {
          operator_delete((void *)local_310._0_8_,CONCAT44(local_310._20_4_,local_310._16_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,
                          CONCAT17(local_440.field_2._M_local_buf[7],
                                   local_440.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p,
                          (ulong)(local_460.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
          operator_delete(local_240.m_description._M_dataplus._M_p,
                          local_240.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
          operator_delete(local_240.m_name._M_dataplus._M_p,
                          local_240.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._0_8_ != &local_3a8) {
          operator_delete((void *)local_3b8._0_8_,(ulong)(local_3a8._M_allocated_capacity + 1));
        }
        uVar10 = local_3d0._M_allocated_capacity;
        TVar12 = (TextureFormat)local_3e0._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._0_8_ != &local_3d0) goto LAB_016d2864;
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"Image verification failed, found invalid pixels.",
                   0x30);
        pTVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        local_310._0_8_ = (Functions *)0x11;
        local_460._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_460,(ulong)local_310);
        local_460.field_2._M_allocated_capacity = local_310._0_8_;
        *(undefined8 *)local_460._M_dataplus._M_p = 0x7265566567616d49;
        builtin_strncpy((char *)((long)local_460._M_dataplus._M_p + 8),"ificatio",8);
        *(char *)((long)local_460._M_dataplus._M_p + 0x10) = 'n';
        local_460._M_string_length = local_310._0_8_;
        *(char *)(local_310._0_8_ + (long)local_460._M_dataplus._M_p) = '\0';
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        local_310._0_8_ = (Functions *)0x12;
        local_440._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_440,(ulong)local_310);
        local_440.field_2._M_allocated_capacity._0_7_ = (undefined7)local_310._0_8_;
        local_440.field_2._M_local_buf[7] = SUB81(local_310._0_8_,7);
        *(undefined8 *)local_440._M_dataplus._M_p = 0x6576206567616d49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 8) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 9) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 10) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xb) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xc) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xd) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xe) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0xf) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0x10) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p + 0x11) = 'n';
        local_440._M_string_length = local_310._0_8_;
        local_440._M_dataplus._M_p[local_310._0_8_] = '\0';
        tcu::LogImageSet::LogImageSet(&local_280,&local_460,&local_440);
        tcu::TestLog::startImageSet
                  (pTVar6,local_280.m_name._M_dataplus._M_p,local_280.m_description._M_dataplus._M_p
                  );
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        local_408.field_2._M_allocated_capacity._4_2_ = 0x746c;
        local_408.field_2._M_allocated_capacity._0_4_ = 0x75736552;
        local_408._M_string_length = 6;
        local_408.field_2._M_local_buf[6] = '\0';
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        local_350.field_2._8_7_ = 0x746c7573657220;
        local_350.field_2._M_allocated_capacity._0_7_ = 0x657265646e6552;
        local_350.field_2._M_local_buf[7] = 'd';
        local_350._M_string_length = 0xf;
        local_350.field_2._M_local_buf[0xf] = '\0';
        local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
        pvVar13 = (void *)(pSVar1->m_pixels).m_cap;
        if (pvVar13 != (void *)0x0) {
          pvVar13 = (pSVar1->m_pixels).m_ptr;
        }
        pCVar7 = (ConstPixelBufferAccess *)local_3e0;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (pCVar7,(TextureFormat *)&local_240,pSVar1->m_width,pSVar1->m_height,1,pvVar13);
        tcu::LogImage::LogImage
                  ((LogImage *)local_310,&local_408,&local_350,pCVar7,QP_IMAGE_COMPRESSION_MODE_BEST
                  );
        tcu::LogImage::write((LogImage *)local_310,(int)pTVar6,__buf,(size_t)pCVar7);
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        local_370.field_2._M_allocated_capacity = 0x73614d726f727245;
        local_370.field_2._M_local_buf[8] = 'k';
        local_370._M_string_length = 9;
        local_370.field_2._M_local_buf[9] = '\0';
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        local_390.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_390.field_2._8_2_ = 0x6b73;
        local_390._M_string_length = 10;
        local_390.field_2._M_local_buf[10] = '\0';
        local_318.order = RGBA;
        local_318.type = UNORM_INT8;
        pvVar13 = (void *)local_420.m_pixels.m_cap;
        if ((void *)local_420.m_pixels.m_cap != (void *)0x0) {
          pvVar13 = local_420.m_pixels.m_ptr;
        }
        pCVar7 = (ConstPixelBufferAccess *)local_3b8;
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)pCVar7,&local_318,local_420.m_width,local_420.m_height,1,
                   pvVar13);
        tcu::LogImage::LogImage
                  (&local_240,&local_370,&local_390,pCVar7,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_240,(int)pTVar6,__buf_00,(size_t)pCVar7);
        tcu::TestLog::endImageSet(pTVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
          operator_delete(local_240.m_description._M_dataplus._M_p,
                          local_240.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
          operator_delete(local_240.m_name._M_dataplus._M_p,
                          local_240.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_p != local_2e0) {
          operator_delete(local_2f0._M_p,local_2e0[0]._M_allocated_capacity + 1);
        }
        if ((Functions *)local_310._0_8_ != (Functions *)(local_310 + 0x10)) {
          operator_delete((void *)local_310._0_8_,CONCAT44(local_310._20_4_,local_310._16_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,
                          CONCAT17(local_350.field_2._M_local_buf[7],
                                   local_350.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,
                          CONCAT17(local_408.field_2._M_local_buf[7],
                                   CONCAT16(local_408.field_2._M_local_buf[6],
                                            CONCAT24(local_408.field_2._M_allocated_capacity._4_2_,
                                                     local_408.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
          operator_delete(local_280.m_description._M_dataplus._M_p,
                          local_280.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
          operator_delete(local_280.m_name._M_dataplus._M_p,
                          local_280.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,
                          CONCAT17(local_440.field_2._M_local_buf[7],
                                   local_440.field_2._M_allocated_capacity._0_7_) + 1);
        }
        uVar10 = local_460.field_2._M_allocated_capacity;
        TVar12 = (TextureFormat)local_460._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
LAB_016d2864:
          operator_delete((void *)TVar12,
                          (ulong)((long)&((Functions *)uVar10)->activeShaderProgram + 1));
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      bVar14 = bVar14 & ((byte)iVar3 ^ 1);
      tcu::Surface::~Surface(&local_420);
      lVar9 = local_3e8 + 1;
    } while (lVar9 < this->m_numLayers);
    testResult = (byte)~bVar14 & QP_TEST_RESULT_FAIL;
    description = "Image verification failed";
    if (bVar14 != 0) {
      description = "Pass";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::~vector(&local_330);
  return STOP;
}

Assistant:

GridRenderCase::IterateResult GridRenderCase::iterate (void)
{
	std::vector<tcu::Surface>	renderedLayers	(m_numLayers);
	bool						allLayersOk		= true;

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		renderedLayers[ndx].setSize(RENDER_SIZE, RENDER_SIZE);

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)." << tcu::TestLog::EndMessage;

	try
	{
		renderTo(renderedLayers);
	}
	catch (const AllowedRenderFailureException& ex)
	{
		// Got accepted failure
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Could not render, reason: " << ex.what() << "\n"
			<< "Failure is allowed."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		allLayersOk &= verifyResultLayer(ndx, renderedLayers[ndx]);

	if (allLayersOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	return STOP;
}